

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef __thiscall llvm::Triple::getARMCPUForArch(Triple *this,StringRef MArch)

{
  StringRef SVar1;
  char *pcVar2;
  OSType OVar3;
  EnvironmentType EVar4;
  Triple *extraout_RDX;
  Triple *extraout_RDX_00;
  Triple *extraout_RDX_01;
  Triple *__s1;
  Triple *pTVar5;
  bool bVar6;
  StringRef Arch;
  StringRef Arch_00;
  char *local_2b8 [2];
  Triple *local_2a8;
  char *local_2a0;
  undefined1 local_298 [8];
  StringRef CPU;
  char *local_268 [2];
  Triple *local_258;
  Triple *local_250;
  Triple *local_248;
  char *pcStack_240;
  StringRef local_230;
  StringRef local_220;
  Triple *local_210;
  Triple *this_local;
  StringRef MArch_local;
  StringRef local_1f0;
  char *local_1e0;
  char **local_1d8;
  char *local_1d0;
  StringRef *local_1c8;
  char *local_1c0;
  StringRef *local_1b8;
  char *local_1b0;
  size_t *local_1a8;
  char *local_1a0;
  StringRef *local_198;
  char *local_190;
  char **local_188;
  char *local_180;
  StringRef *local_178;
  char *local_170;
  StringRef *local_168;
  char *local_160;
  StringRef *local_158;
  char *local_150;
  StringRef *local_148;
  char *local_140;
  StringRef *local_138;
  undefined1 *local_130;
  Triple **local_128;
  Triple **local_120;
  Triple **local_118;
  size_t local_110;
  char *local_108;
  size_t local_100;
  char *local_f8;
  Triple *local_f0;
  char *local_e8;
  char *local_e0;
  Triple *local_d8;
  char *local_d0;
  Triple *local_c8;
  Triple *local_c0;
  Triple *local_b8;
  Triple **local_b0;
  char *local_a8;
  Triple *local_a0;
  Triple **local_98;
  size_t local_90;
  char *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  int local_4c;
  char *local_48;
  size_t local_40;
  Triple *local_38;
  int local_2c;
  Triple *local_28;
  char *local_20;
  Triple *local_18;
  int local_c;
  
  MArch_local.Data = (char *)MArch.Length;
  this_local = (Triple *)MArch.Data;
  local_118 = &this_local;
  local_210 = this;
  if (MArch_local.Data == (char *)0x0) {
    local_220 = getArchName(this);
    MArch_local.Data = (char *)local_220.Length;
    this_local = (Triple *)local_220.Data;
  }
  local_248 = this_local;
  pcStack_240 = MArch_local.Data;
  Arch.Length = (size_t)MArch_local.Data;
  Arch.Data = MArch_local.Data;
  local_230 = ARM::getCanonicalArchName((ARM *)this_local,Arch);
  this_local = (Triple *)local_230.Data;
  MArch_local.Data = (char *)local_230.Length;
  OVar3 = getOS(this);
  pcVar2 = MArch_local.Data;
  __s1 = this_local;
  if (OVar3 == FreeBSD) {
LAB_0019e84f:
    local_120 = &this_local;
    bVar6 = false;
    pTVar5 = extraout_RDX;
    if (MArch_local.Data != (char *)0x0) {
      local_258 = this_local;
      local_250 = (Triple *)MArch_local.Data;
      local_1d8 = local_268;
      local_1e0 = "v6";
      local_268[0] = "v6";
      local_d8 = (Triple *)strlen("v6");
      local_c0 = local_258;
      local_b8 = local_250;
      local_d0 = local_268[0];
      local_e0 = local_268[0];
      local_a8 = local_268[0];
      local_b0 = &local_c0;
      bVar6 = false;
      pTVar5 = local_250;
      local_c8 = local_d8;
      local_a0 = local_d8;
      if (local_250 == local_d8) {
        local_18 = local_258;
        local_20 = local_268[0];
        local_28 = local_d8;
        if (local_d8 == (Triple *)0x0) {
          local_c = 0;
          pTVar5 = local_258;
        }
        else {
          local_c = memcmp(local_258,local_268[0],(size_t)local_d8);
          pTVar5 = extraout_RDX_00;
        }
        bVar6 = local_c == 0;
      }
    }
    if (bVar6) {
      local_1c8 = &local_1f0;
      local_1d0 = "arm1176jzf-s";
      local_1f0.Data = "arm1176jzf-s";
      local_1f0.Length = strlen("arm1176jzf-s");
      goto LAB_0019f1e2;
    }
  }
  else if ((OVar3 == IOS) || (OVar3 == MacOSX)) {
LAB_0019eb09:
    local_1a8 = &CPU.Length;
    local_1b0 = "v7k";
    CPU.Length = (long)"armv7k" + 3;
    local_108 = (char *)strlen("v7k");
    local_f0 = __s1;
    local_e8 = pcVar2;
    local_100 = CPU.Length;
    local_110 = CPU.Length;
    local_90 = CPU.Length;
    local_98 = &local_f0;
    bVar6 = false;
    pTVar5 = (Triple *)pcVar2;
    local_f8 = local_108;
    local_88 = local_108;
    if (pcVar2 == local_108) {
      local_38 = __s1;
      local_40 = CPU.Length;
      local_48 = local_108;
      if (local_108 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(__s1,(void *)CPU.Length,(size_t)local_108);
        __s1 = extraout_RDX_01;
      }
      bVar6 = local_2c == 0;
      pTVar5 = __s1;
    }
    if (bVar6) {
      local_198 = &local_1f0;
      local_1a0 = "cortex-a7";
      local_1f0.Data = "cortex-a7";
      local_1f0.Length = strlen("cortex-a7");
      goto LAB_0019f1e2;
    }
  }
  else {
    if (OVar3 == NetBSD) goto LAB_0019e84f;
    if (OVar3 == Win32) {
      local_1b8 = &local_1f0;
      local_1c0 = "cortex-a9";
      local_1f0.Data = "cortex-a9";
      local_1f0.Length = strlen("cortex-a9");
      goto LAB_0019f1e2;
    }
    pTVar5 = extraout_RDX;
    if (OVar3 - TvOS < 2) goto LAB_0019eb09;
  }
  local_128 = &this_local;
  if (MArch_local.Data == (char *)0x0) {
    memset(&local_1f0,0,0x10);
    StringRef::StringRef(&local_1f0);
  }
  else {
    local_2a8 = this_local;
    local_2a0 = MArch_local.Data;
    Arch_00.Length = (size_t)pTVar5;
    Arch_00.Data = MArch_local.Data;
    _local_298 = ARM::getDefaultCPU((ARM *)this_local,Arch_00);
    local_130 = local_298;
    bVar6 = false;
    if (CPU.Data != (char *)0x0) {
      local_188 = local_2b8;
      local_190 = "invalid";
      local_2b8[0] = "invalid";
      local_70 = (char *)strlen("invalid");
      local_78 = local_2b8[0];
      local_80 = local_298;
      bVar6 = false;
      if (CPU.Data == local_70) {
        local_58 = (char *)local_298;
        local_60 = local_2b8[0];
        local_68 = local_70;
        if (local_70 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp((void *)local_298,local_2b8[0],(size_t)local_70);
        }
        bVar6 = local_4c == 0;
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    if (bVar6) {
      local_1f0.Data = (char *)local_298;
      local_1f0.Length = (size_t)CPU.Data;
    }
    else {
      OVar3 = getOS(this);
      if (OVar3 == NetBSD) {
        EVar4 = getEnvironment(this);
        if ((EVar4 - GNUEABI < 2) || (EVar4 == EABI || EVar4 == EABIHF)) {
          local_178 = &local_1f0;
          local_180 = "arm926ej-s";
          local_1f0.Data = "arm926ej-s";
          local_1f0.Length = strlen("arm926ej-s");
        }
        else {
          local_168 = &local_1f0;
          local_170 = "strongarm";
          local_1f0.Data = "strongarm";
          local_1f0.Length = strlen("strongarm");
        }
      }
      else if ((OVar3 == OpenBSD) || (OVar3 == NaCl)) {
        local_158 = &local_1f0;
        local_160 = "cortex-a8";
        local_1f0.Data = "cortex-a8";
        local_1f0.Length = strlen("cortex-a8");
      }
      else {
        EVar4 = getEnvironment(this);
        if (((EVar4 == GNUEABIHF) || (EVar4 == EABIHF)) || (EVar4 == MuslEABIHF)) {
          local_148 = &local_1f0;
          local_150 = "arm1176jzf-s";
          local_1f0.Data = "arm1176jzf-s";
          local_1f0.Length = strlen("arm1176jzf-s");
        }
        else {
          local_138 = &local_1f0;
          local_140 = "arm7tdmi";
          local_1f0.Data = "arm7tdmi";
          local_1f0.Length = strlen("arm7tdmi");
        }
      }
    }
  }
LAB_0019f1e2:
  SVar1.Length = local_1f0.Length;
  SVar1.Data = local_1f0.Data;
  return SVar1;
}

Assistant:

StringRef Triple::getARMCPUForArch(StringRef MArch) const {
  if (MArch.empty())
    MArch = getArchName();
  MArch = ARM::getCanonicalArchName(MArch);

  // Some defaults are forced.
  switch (getOS()) {
  case llvm::Triple::FreeBSD:
  case llvm::Triple::NetBSD:
    if (!MArch.empty() && MArch == "v6")
      return "arm1176jzf-s";
    break;
  case llvm::Triple::Win32:
    // FIXME: this is invalid for WindowsCE
    return "cortex-a9";
  case llvm::Triple::MacOSX:
  case llvm::Triple::IOS:
  case llvm::Triple::WatchOS:
  case llvm::Triple::TvOS:
    if (MArch == "v7k")
      return "cortex-a7";
    break;
  default:
    break;
  }

  if (MArch.empty())
    return StringRef();

  StringRef CPU = ARM::getDefaultCPU(MArch);
  if (!CPU.empty() && !CPU.equals("invalid"))
    return CPU;

  // If no specific architecture version is requested, return the minimum CPU
  // required by the OS and environment.
  switch (getOS()) {
  case llvm::Triple::NetBSD:
    switch (getEnvironment()) {
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::GNUEABI:
    case llvm::Triple::EABIHF:
    case llvm::Triple::EABI:
      return "arm926ej-s";
    default:
      return "strongarm";
    }
  case llvm::Triple::NaCl:
  case llvm::Triple::OpenBSD:
    return "cortex-a8";
  default:
    switch (getEnvironment()) {
    case llvm::Triple::EABIHF:
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::MuslEABIHF:
      return "arm1176jzf-s";
    default:
      return "arm7tdmi";
    }
  }

  llvm_unreachable("invalid arch name");
}